

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diskdata.c
# Opt level: O3

FILE * OpenDataFile(char *mode)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  stat sb;
  char filePath [256];
  stat sStack_1a8;
  char local_118 [256];
  
  pcVar2 = getenv("HOME");
  if (pcVar2 == (char *)0x0) {
LAB_001022bd:
    pFVar3 = (FILE *)0x0;
  }
  else {
    sprintf(local_118,"%s/%s",pcVar2,".textolitaire");
    iVar1 = stat(local_118,&sStack_1a8);
    if ((iVar1 != 0) || ((sStack_1a8.st_mode & 0xf000) != 0x4000)) {
      iVar1 = mkdir(local_118,0x1e8);
      if (iVar1 != 0) goto LAB_001022bd;
    }
    sprintf(local_118,"%s/%s/%s",pcVar2,".textolitaire","data.txt");
    pFVar3 = fopen(local_118,mode);
  }
  return (FILE *)pFVar3;
}

Assistant:

static FILE* OpenDataFile(const char* mode)
{
  char filePath[256];
  struct stat sb;
  const char* homeDir = getenv("HOME");

  if (homeDir) {
    sprintf(filePath, "%s/%s", homeDir, SubDirName);
    if (stat(filePath, &sb) == RET_OK && S_ISDIR(sb.st_mode)) {
      // directory exits
    } else {
      if (mkdir(filePath, 0750) != RET_OK) {
        return NULL; // failed to create directory
      }
    }

    sprintf(filePath, "%s/%s/%s", homeDir, SubDirName, FileName);
    return fopen(filePath, mode);
  }

  return NULL;
}